

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O2

lu_int basiclu_obj_solve_sparse
                 (basiclu_object *obj,lu_int nzrhs,lu_int *irhs,double *xrhs,char trans)

{
  lu_int lVar1;
  
  lVar1 = isvalid(obj);
  if (lVar1 == 0) {
    lVar1 = -8;
  }
  else {
    lu_clear_lhs(obj);
    lVar1 = basiclu_solve_sparse
                      (obj->istore,obj->xstore,obj->Li,obj->Lx,obj->Ui,obj->Ux,obj->Wi,obj->Wx,nzrhs
                       ,irhs,xrhs,&obj->nzlhs,obj->ilhs,obj->lhs,trans);
  }
  return lVar1;
}

Assistant:

lu_int basiclu_obj_solve_sparse(struct basiclu_object *obj, lu_int nzrhs,
                                const lu_int irhs[], const double xrhs[],
                                char trans)
{
    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    lu_clear_lhs(obj);
    return basiclu_solve_sparse(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                obj->Ui, obj->Ux, obj->Wi, obj->Wx, nzrhs, irhs,
                                xrhs, &obj->nzlhs, obj->ilhs, obj->lhs, trans);
}